

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

string * __thiscall
fmt::v7::detail::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_00;
  undefined1 local_260 [8];
  memory_buffer buf;
  parse_context local_28;
  
  buf.super_buffer<char>._vptr_buffer = (_func_int **)&buf.super_buffer<char>.capacity_;
  buf.super_buffer<char>.ptr_ = (char *)0x0;
  local_260 = (undefined1  [8])&PTR_grow_002b0bf8;
  local_28.next_arg_id_ = 0;
  buf.super_buffer<char>.size_ = 500;
  buf._528_8_ = local_260;
  local_28.format_str_.data_ = (char *)0x0;
  local_28.format_str_.size_ = 0;
  (*h.custom_.format)(h.custom_.value,&local_28,
                      (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                      (buf.store_ + 0x1f0));
  to_string<char,500ul>(__return_storage_ptr__,(v7 *)local_260,buf_00);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_260);
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }